

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void __thiscall
ReplayInterface::set_application_info
          (ReplayInterface *this,Hash hash,VkApplicationInfo *info,
          VkPhysicalDeviceFeatures2 *features)

{
  bool bVar1;
  Hash HVar2;
  StateRecorderApplicationFeatureHash local_38;
  VkPhysicalDeviceFeatures2 *local_28;
  VkPhysicalDeviceFeatures2 *features_local;
  VkApplicationInfo *info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  local_28 = features;
  features_local = (VkPhysicalDeviceFeatures2 *)info;
  info_local = (VkApplicationInfo *)hash;
  hash_local = (Hash)this;
  local_38 = Fossilize::Hashing::compute_application_feature_hash(info,features);
  HVar2 = Fossilize::Hashing::compute_combined_application_feature_hash(&local_38);
  this->feature_hash = HVar2;
  if ((VkApplicationInfo *)this->feature_hash != info_local) {
    abort();
  }
  if ((features_local != (VkPhysicalDeviceFeatures2 *)0x0) &&
     (bVar1 = Fossilize::StateRecorder::record_application_info
                        (&this->recorder,(VkApplicationInfo *)features_local), !bVar1)) {
    abort();
  }
  if ((local_28 != (VkPhysicalDeviceFeatures2 *)0x0) &&
     (bVar1 = Fossilize::StateRecorder::record_physical_device_features(&this->recorder,local_28),
     !bVar1)) {
    abort();
  }
  return;
}

Assistant:

void set_application_info(Hash hash, const VkApplicationInfo *info, const VkPhysicalDeviceFeatures2 *features) override
	{
		feature_hash = Hashing::compute_combined_application_feature_hash(Hashing::compute_application_feature_hash(info, features));
		if (feature_hash != hash)
			abort();

		if (info)
			if (!recorder.record_application_info(*info))
				abort();
		if (features)
			if (!recorder.record_physical_device_features(features))
				abort();
	}